

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcConstructionMaterialResource::IfcConstructionMaterialResource
          (IfcConstructionMaterialResource *this)

{
  *(undefined ***)&this->field_0x1b8 = &PTR__Object_00814a00;
  *(undefined8 *)&this->field_0x1c0 = 0;
  *(char **)&this->field_0x1c8 = "IfcConstructionMaterialResource";
  IfcConstructionResource::IfcConstructionResource
            (&this->super_IfcConstructionResource,&PTR_construction_vtable_24__008a6850);
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x180 = 0;
  *(undefined8 *)&this->super_IfcConstructionResource = 0x8a6748;
  *(undefined8 *)&this->field_0x1b8 = 0x8a6838;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x88 = 0x8a6770;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x98 = 0x8a6798;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0xd0 = 0x8a67c0;
  (this->super_IfcConstructionResource).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>._vptr_ObjectHelper =
       (_func_int **)0x8a67e8;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x178 = 0x8a6810;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x188 = 0;
  *(undefined8 *)&this->field_0x190 = 0;
  *(undefined8 *)&this->field_0x191 = 0;
  *(undefined8 *)&this->field_0x199 = 0;
  (this->UsageRatio).have = false;
  return;
}

Assistant:

IfcConstructionMaterialResource() : Object("IfcConstructionMaterialResource") {}